

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int __thiscall sptk::swipe::bisectv(swipe *this,vector yr_vector,double key)

{
  int iVar1;
  int hi;
  int lo;
  int md;
  double key_local;
  vector yr_vector_local;
  
  lo = 1;
  hi = (int)this;
  iVar1 = lo;
  while (lo = iVar1, 1 < hi - lo) {
    iVar1 = hi + lo >> 1;
    if (key < *(double *)(yr_vector._0_8_ + (long)iVar1 * 8)) {
      hi = iVar1;
      iVar1 = lo;
    }
  }
  return hi;
}

Assistant:

int bisectv(vector yr_vector, double key) {
    int md;
    int lo = 1;
    int hi = yr_vector.x;
    while (hi - lo > 1) {
        md = (hi + lo) >> 1;
        if (yr_vector.v[md] > key)
            hi = md;
        else
            lo = md;
    }
    return(hi);
}